

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StructureDecode(u8 *pData,int nData,int *piCookie,Fts5Structure **ppOut)

{
  long lVar1;
  u32 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fts5StructureSegment *pFVar9;
  long lVar10;
  u32 uVar11;
  Fts5StructureLevel *v;
  int iVar12;
  ulong uVar13;
  u32 *v_00;
  bool bVar14;
  int rc;
  int nTotal;
  int nLevel;
  int local_7c;
  ulong local_78;
  int local_70;
  u32 local_6c;
  ulong local_68;
  u32 local_60;
  u32 local_5c;
  Fts5Structure *local_58;
  Fts5Structure **local_50;
  ulong local_48;
  Fts5StructureLevel *local_40;
  ulong local_38;
  
  local_7c = 0;
  local_5c = 0;
  local_60 = 0;
  if (piCookie != (int *)0x0) {
    uVar4 = *(uint *)pData;
    *piCookie = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  }
  local_70 = nData;
  uVar4 = sqlite3Fts5GetVarint32(pData + 4,&local_5c);
  uVar5 = sqlite3Fts5GetVarint32(pData + (ulong)uVar4 + 4,&local_60);
  uVar2 = local_5c;
  uVar11 = local_60;
  local_78 = (ulong)uVar5;
  uVar13 = (ulong)(int)local_5c;
  if (2000 < local_60 || 2000 < uVar13) {
    return 0x10b;
  }
  local_50 = ppOut;
  local_58 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_7c,(uVar13 - 1) * 0x10 + 0x28);
  iVar6 = local_7c;
  if (local_58 != (Fts5Structure *)0x0) {
    uVar4 = uVar4 + (int)local_78 + 4;
    local_58->nRef = 1;
    local_58->nLevel = uVar2;
    local_58->nSegment = uVar11;
    local_68 = uVar13 - 1;
    bVar3 = sqlite3Fts5GetVarint(pData + uVar4,&local_58->nWriteCounter);
    bVar14 = iVar6 == 0;
    local_38 = uVar13;
    if (uVar2 != 0 && bVar14) {
      iVar12 = uVar4 + bVar3;
      local_40 = local_58->aLevel;
      local_48 = local_68 & 0xffffffff;
      uVar13 = 0;
      do {
        local_6c = 0;
        iVar8 = 0x10b;
        if (local_70 <= iVar12) goto LAB_001c884c;
        v = local_40 + uVar13;
        local_68 = uVar13;
        iVar6 = sqlite3Fts5GetVarint32(pData + iVar12,(u32 *)v);
        iVar7 = sqlite3Fts5GetVarint32(pData + (iVar6 + iVar12),&local_6c);
        local_78 = (ulong)local_6c;
        if ((int)local_6c < v->nMerge) {
          local_7c = 0x10b;
        }
        pFVar9 = (Fts5StructureSegment *)sqlite3Fts5MallocZero(&local_7c,(long)(int)local_6c * 0xc);
        v->aSeg = pFVar9;
        iVar8 = local_7c;
        if (local_7c != 0) goto LAB_001c884c;
        iVar12 = iVar6 + iVar12 + iVar7;
        v->nSeg = (int)local_78;
        iVar6 = 0;
        if (0 < (int)local_78) {
          lVar1 = local_78 * 0xc;
          lVar10 = 0;
          do {
            if (local_70 <= iVar12) {
LAB_001c87b3:
              local_7c = 0x10b;
              iVar6 = 0x10b;
              goto LAB_001c87d2;
            }
            pFVar9 = v->aSeg;
            iVar6 = sqlite3Fts5GetVarint32(pData + iVar12,(u32 *)((long)&pFVar9->iSegid + lVar10));
            iVar8 = sqlite3Fts5GetVarint32
                              (pData + (iVar6 + iVar12),(u32 *)((long)&pFVar9->pgnoFirst + lVar10));
            iVar8 = iVar6 + iVar12 + iVar8;
            v_00 = (u32 *)((long)&pFVar9->pgnoLast + lVar10);
            iVar12 = sqlite3Fts5GetVarint32(pData + iVar8,v_00);
            iVar12 = iVar8 + iVar12;
            if ((int)*v_00 < *(int *)((long)&pFVar9->pgnoFirst + lVar10)) goto LAB_001c87b3;
            lVar10 = lVar10 + 0xc;
          } while (lVar1 != lVar10);
          iVar6 = 0;
        }
LAB_001c87d2:
        if (((local_68 != 0) && ((int)local_78 == 0)) && ((int)*(u64 *)(v + -1) != 0)) {
          local_7c = 0x10b;
          iVar6 = 0x10b;
        }
        if ((local_68 == local_48) && (iVar8 = 0x10b, v->nMerge != 0)) goto LAB_001c884c;
        uVar11 = uVar11 - (int)local_78;
        bVar14 = iVar6 == 0;
      } while ((bVar14) && (uVar13 = local_68 + 1, uVar13 < local_38));
    }
    iVar8 = 0x10b;
    if ((!(bool)(bVar14 & uVar11 != 0)) && (iVar8 = iVar6, iVar6 == 0)) {
      local_7c = 0;
      goto LAB_001c8858;
    }
LAB_001c884c:
    fts5StructureRelease(local_58);
    local_7c = iVar8;
  }
  local_58 = (Fts5Structure *)0x0;
LAB_001c8858:
  *local_50 = local_58;
  return local_7c;
}

Assistant:

static int fts5StructureDecode(
  const u8 *pData,                /* Buffer containing serialized structure */
  int nData,                      /* Size of buffer pData in bytes */
  int *piCookie,                  /* Configuration cookie value */
  Fts5Structure **ppOut           /* OUT: Deserialized object */
){
  int rc = SQLITE_OK;
  int i = 0;
  int iLvl;
  int nLevel = 0;
  int nSegment = 0;
  sqlite3_int64 nByte;            /* Bytes of space to allocate at pRet */
  Fts5Structure *pRet = 0;        /* Structure object to return */

  /* Grab the cookie value */
  if( piCookie ) *piCookie = sqlite3Fts5Get32(pData);
  i = 4;

  /* Read the total number of levels and segments from the start of the
  ** structure record.  */
  i += fts5GetVarint32(&pData[i], nLevel);
  i += fts5GetVarint32(&pData[i], nSegment);
  if( nLevel>FTS5_MAX_SEGMENT   || nLevel<0
   || nSegment>FTS5_MAX_SEGMENT || nSegment<0
  ){
    return FTS5_CORRUPT;
  }
  nByte = (
      sizeof(Fts5Structure) +                    /* Main structure */
      sizeof(Fts5StructureLevel) * (nLevel-1)    /* aLevel[] array */
  );
  pRet = (Fts5Structure*)sqlite3Fts5MallocZero(&rc, nByte);

  if( pRet ){
    pRet->nRef = 1;
    pRet->nLevel = nLevel;
    pRet->nSegment = nSegment;
    i += sqlite3Fts5GetVarint(&pData[i], &pRet->nWriteCounter);

    for(iLvl=0; rc==SQLITE_OK && iLvl<nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pRet->aLevel[iLvl];
      int nTotal = 0;
      int iSeg;

      if( i>=nData ){
        rc = FTS5_CORRUPT;
      }else{
        i += fts5GetVarint32(&pData[i], pLvl->nMerge);
        i += fts5GetVarint32(&pData[i], nTotal);
        if( nTotal<pLvl->nMerge ) rc = FTS5_CORRUPT;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&rc, 
            nTotal * sizeof(Fts5StructureSegment)
        );
        nSegment -= nTotal;
      }

      if( rc==SQLITE_OK ){
        pLvl->nSeg = nTotal;
        for(iSeg=0; iSeg<nTotal; iSeg++){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          if( i>=nData ){
            rc = FTS5_CORRUPT;
            break;
          }
          i += fts5GetVarint32(&pData[i], pSeg->iSegid);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoFirst);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoLast);
          if( pSeg->pgnoLast<pSeg->pgnoFirst ){
            rc = FTS5_CORRUPT;
            break;
          }
        }
        if( iLvl>0 && pLvl[-1].nMerge && nTotal==0 ) rc = FTS5_CORRUPT;
        if( iLvl==nLevel-1 && pLvl->nMerge ) rc = FTS5_CORRUPT;
      }
    }
    if( nSegment!=0 && rc==SQLITE_OK ) rc = FTS5_CORRUPT;

    if( rc!=SQLITE_OK ){
      fts5StructureRelease(pRet);
      pRet = 0;
    }
  }

  *ppOut = pRet;
  return rc;
}